

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LA32WaveGenerator.cpp
# Opt level: O2

void __thiscall
MT32Emu::LA32WaveGenerator::initSynth
          (LA32WaveGenerator *this,bool useSawtoothWaveform,Bit8u usePulseWidth,Bit8u useResonance)

{
  Tables *pTVar1;
  undefined7 in_register_00000009;
  
  this->sawtoothWaveform = useSawtoothWaveform;
  this->pulseWidth = usePulseWidth;
  this->resonance = useResonance;
  this->wavePosition = 0;
  this->squareWavePosition = 0;
  this->phase = POSITIVE_RISING_SINE_SEGMENT;
  this->resonancePhase = POSITIVE_RISING_RESONANCE_SINE_SEGMENT;
  this->resonanceSinePosition = 0;
  this->resonanceAmpSubtraction = (int)CONCAT71(in_register_00000009,useResonance) * -0x400 + 0x8000
  ;
  pTVar1 = Tables::getInstance();
  this->resAmpDecayFactor = (uint)pTVar1->resAmpDecayFactor[this->resonance >> 2] << 2;
  this->pcmWaveAddress = (Bit16s *)0x0;
  this->active = true;
  return;
}

Assistant:

void LA32WaveGenerator::initSynth(const bool useSawtoothWaveform, const Bit8u usePulseWidth, const Bit8u useResonance) {
	sawtoothWaveform = useSawtoothWaveform;
	pulseWidth = usePulseWidth;
	resonance = useResonance;

	wavePosition = 0;

	squareWavePosition = 0;
	phase = POSITIVE_RISING_SINE_SEGMENT;

	resonanceSinePosition = 0;
	resonancePhase = POSITIVE_RISING_RESONANCE_SINE_SEGMENT;
	resonanceAmpSubtraction = (32 - resonance) << 10;
	resAmpDecayFactor = Tables::getInstance().resAmpDecayFactor[resonance >> 2] << 2;

	pcmWaveAddress = NULL;
	active = true;
}